

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<UnsatisfiedJump,_false,_false>::grow_and_add
          (FastVector<UnsatisfiedJump,_false,_false> *this,uint newSize,UnsatisfiedJump *val)

{
  UnsatisfiedJump *pUVar1;
  uint uVar2;
  UnsatisfiedJump *pUVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined3 uVar7;
  
  pUVar3 = this->data;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  bVar6 = val->isNear;
  uVar7 = *(undefined3 *)&val->field_0x5;
  uVar4 = *(undefined4 *)&val->jmpPos;
  uVar5 = *(undefined4 *)((long)&val->jmpPos + 4);
  pUVar1 = this->data + uVar2;
  pUVar1->labelID = val->labelID;
  pUVar1->isNear = bVar6;
  *(undefined3 *)&pUVar1->field_0x5 = uVar7;
  *(undefined4 *)&pUVar1->jmpPos = uVar4;
  *(undefined4 *)((long)&pUVar1->jmpPos + 4) = uVar5;
  if (pUVar3 != (UnsatisfiedJump *)0x0) {
    (*(code *)NULLC::dealloc)(pUVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}